

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O0

vector<OpTpl_*,_std::allocator<OpTpl_*>_> * __thiscall
PcodeCompile::createOpNoOut(PcodeCompile *this,OpCode opc,ExprTree *vn1,ExprTree *vn2)

{
  vector<OpTpl*,std::allocator<OpTpl*>> *this_00;
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *pvVar1;
  ExprTree *pEVar2;
  OpTpl *this_01;
  OpTpl *local_60;
  OpTpl *op;
  OpTpl **local_50;
  __normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_> local_48;
  __normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_> local_40;
  const_iterator local_38;
  vector<OpTpl*,std::allocator<OpTpl*>> *local_30;
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *res;
  ExprTree *vn2_local;
  ExprTree *vn1_local;
  PcodeCompile *pPStack_10;
  OpCode opc_local;
  PcodeCompile *this_local;
  
  this_00 = (vector<OpTpl*,std::allocator<OpTpl*>> *)vn1->ops;
  vn1->ops = (vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)0x0;
  local_30 = this_00;
  res = (vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)vn2;
  vn2_local = vn1;
  vn1_local._4_4_ = opc;
  pPStack_10 = this;
  local_40._M_current =
       (OpTpl **)
       std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::end
                 ((vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)this_00);
  __gnu_cxx::__normal_iterator<OpTpl*const*,std::vector<OpTpl*,std::allocator<OpTpl*>>>::
  __normal_iterator<OpTpl**>
            ((__normal_iterator<OpTpl*const*,std::vector<OpTpl*,std::allocator<OpTpl*>>> *)&local_38
             ,&local_40);
  local_48._M_current =
       (OpTpl **)
       std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::begin
                 ((vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)
                  (res->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
                  super__Vector_impl_data._M_start);
  local_50 = (OpTpl **)
             std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::end
                       ((vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)
                        (res->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
                        super__Vector_impl_data._M_start);
  op = (OpTpl *)std::vector<OpTpl*,std::allocator<OpTpl*>>::
                insert<__gnu_cxx::__normal_iterator<OpTpl**,std::vector<OpTpl*,std::allocator<OpTpl*>>>,void>
                          (this_00,local_38,local_48,
                           (__normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
                            )local_50);
  std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::clear
            ((vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)
             (res->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
             super__Vector_impl_data._M_start);
  this_01 = (OpTpl *)operator_new(0x28);
  OpTpl::OpTpl(this_01,vn1_local._4_4_);
  local_60 = this_01;
  OpTpl::addInput(this_01,vn2_local->outvn);
  vn2_local->outvn = (VarnodeTpl *)0x0;
  OpTpl::addInput(local_60,(VarnodeTpl *)
                           (res->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.
                           super__Vector_impl_data._M_finish);
  (res->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::push_back
            ((vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)local_30,&local_60);
  pEVar2 = vn2_local;
  if (vn2_local != (ExprTree *)0x0) {
    ExprTree::~ExprTree(vn2_local);
    operator_delete(pEVar2);
  }
  pvVar1 = res;
  if (res != (vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)0x0) {
    ExprTree::~ExprTree((ExprTree *)res);
    operator_delete(pvVar1);
  }
  return (vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)local_30;
}

Assistant:

vector<OpTpl *> *PcodeCompile::createOpNoOut(OpCode opc,ExprTree *vn1,ExprTree *vn2)

{				// Create new expression by creating op with given -opc-
				// and inputs vn1 and vn2. Free the input expressions
  vector<OpTpl *> *res = vn1->ops;
  vn1->ops = (vector<OpTpl *> *)0;
  res->insert(res->end(),vn2->ops->begin(),vn2->ops->end());
  vn2->ops->clear();
  OpTpl *op = new OpTpl(opc);
  op->addInput(vn1->outvn);
  vn1->outvn = (VarnodeTpl *)0;
  op->addInput(vn2->outvn);
  vn2->outvn = (VarnodeTpl *)0;
  res->push_back(op);
  delete vn1;
  delete vn2;
  return res;
}